

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

Slice __thiscall leveldb::FilterBlockBuilder::Finish(FilterBlockBuilder *this)

{
  bool bVar1;
  size_type sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t i;
  uint32_t array_offset;
  undefined8 in_stack_ffffffffffffffb8;
  string *s;
  string *in_stack_ffffffffffffffc0;
  ulong local_28;
  Slice local_10;
  
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RDI);
  if (!bVar1) {
    GenerateFilter(this);
  }
  std::__cxx11::string::size();
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5));
    if (sVar2 <= local_28) break;
    in_stack_ffffffffffffffc0 =
         (string *)
         &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5),local_28);
    PutFixed32(in_stack_ffffffffffffffc0,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_28 = local_28 + 1;
  }
  s = (string *)
      &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  PutFixed32(in_stack_ffffffffffffffc0,(uint32_t)((ulong)s >> 0x20));
  std::__cxx11::string::push_back((char)s);
  Slice::Slice((Slice *)in_stack_ffffffffffffffc0,s);
  return local_10;
}

Assistant:

Slice FilterBlockBuilder::Finish() {
  if (!start_.empty()) {
    GenerateFilter();
  }

  // Append array of per-filter offsets
  const uint32_t array_offset = (uint32_t)result_.size();
  for (size_t i = 0; i < filter_offsets_.size(); i++) {
    PutFixed32(&result_, filter_offsets_[i]);
  }

  PutFixed32(&result_, array_offset);
  result_.push_back(kFilterBaseLg);  // Save encoding parameter in result
  return Slice(result_);
}